

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

bool __thiscall QPainter::hasClipping(QPainter *this)

{
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var1;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var1._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    bVar3 = false;
    QMessageLogger::warning(local_30,"QPainter::hasClipping: Painter not active");
  }
  else {
    uVar2._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl = ((_Var1._M_head_impl)->state)._M_t;
    if ((*(byte *)((long)uVar2._M_t.
                         super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                         .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x1a0) & 4)
        == 0) {
      bVar3 = false;
    }
    else {
      bVar3 = *(int *)((long)uVar2._M_t.
                             super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                             .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x68) !=
              0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QPainter::hasClipping() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::hasClipping: Painter not active");
        return false;
    }
    return d->state->clipEnabled && d->state->clipOperation != Qt::NoClip;
}